

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O1

void __thiscall reader_authority_suite::test_host_port::test_method(test_host_port *this)

{
  bool bVar1;
  int iVar2;
  uint local_1c8;
  undefined1 local_1c4 [12];
  view_type *local_1b8;
  undefined **local_1b0;
  undefined1 local_1a8;
  undefined8 *local_1a0;
  char *local_198;
  undefined1 local_190 [8];
  undefined8 local_188;
  shared_count sStack_180;
  undefined **local_178;
  undefined1 local_170;
  undefined8 *local_168;
  view_type **local_160;
  undefined **local_158;
  undefined1 local_150;
  undefined8 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  base<char,_trial::url::reader::basic_authority> local_128;
  char input [11];
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  builtin_strncpy(input,"1.2.3.4:80",0xb);
  local_128.input.len_ = strlen(input);
  local_128.current_token = end;
  local_128.input.ptr_ = input;
  local_128.current_view.ptr_ = input;
  local_128.current_view.len_ = local_128.input.len_;
  trial::url::reader::basic_authority<char>::do_next((basic_authority<char> *)&local_128);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x2b);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00186260;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_1c4._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_authority>::code(&local_128);
  local_1b8 = (view_type *)local_1c4;
  local_1c8 = 4;
  local_190[0] = local_1c4._0_4_ == authority_host;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_130 = "";
  local_160 = &local_1b8;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_00186558;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  local_140 = local_1c4 + 4;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_00186558;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_1c4._4_8_ = &local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_138,0x2b,2,2,2,"reader.code()",&local_178,
             "url::token::code::authority_host",&local_158);
  boost::detail::shared_count::~shared_count(&sStack_180);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x2c);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00186260;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  if (local_128.current_view.len_ == 7) {
    iVar2 = bcmp(local_128.current_view.ptr_,"1.2.3.4",7);
    local_190[0] = iVar2 == 0;
  }
  else {
    local_190[0] = false;
  }
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_130 = "";
  local_1b8 = &local_128.current_view;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_00186598;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  local_160 = &local_1b8;
  local_1c4._4_8_ = "1.2.3.4";
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_00186398;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_140 = local_1c4 + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_138,0x2c,2,2,2,"reader.literal()",&local_178,"\"1.2.3.4\"",
             &local_158);
  boost::detail::shared_count::~shared_count(&sStack_180);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x2d);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00186260;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_190[0] = trial::url::reader::basic_authority<char>::do_next
                           ((basic_authority<char> *)&local_128);
  local_1c4[0] = local_190[0];
  local_1c8 = CONCAT31(local_1c8._1_3_,1);
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_130 = "";
  local_1b8 = (view_type *)local_1c4;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_001865d8;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  local_160 = &local_1b8;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_001865d8;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_140 = local_1c4 + 4;
  local_1c4._4_8_ = &local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_138,0x2d,2,2,2,"reader.next()",&local_178,"true",&local_158
            );
  boost::detail::shared_count::~shared_count(&sStack_180);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x2e);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00186260;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_1c4._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_authority>::code(&local_128);
  local_1c8 = 5;
  local_190[0] = local_1c4._0_4_ == authority_port;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_130 = "";
  local_1b8 = (view_type *)local_1c4;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_00186558;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  local_160 = &local_1b8;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_00186558;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_140 = local_1c4 + 4;
  local_1c4._4_8_ = &local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_138,0x2e,2,2,2,"reader.code()",&local_178,
             "url::token::code::authority_port",&local_158);
  boost::detail::shared_count::~shared_count(&sStack_180);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x2f);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00186260;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  if (local_128.current_view.len_ == 2) {
    iVar2 = bcmp(local_128.current_view.ptr_,"80",2);
    local_190[0] = iVar2 == 0;
  }
  else {
    local_190[0] = false;
  }
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_130 = "";
  local_1b8 = &local_128.current_view;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_00186598;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  local_160 = &local_1b8;
  local_1c4._4_8_ = "80";
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_00186658;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_140 = local_1c4 + 4;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_138,0x2f,2,2,2,"reader.literal()",&local_178,"\"80\"",
             &local_158);
  boost::detail::shared_count::~shared_count(&sStack_180);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_d8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x30);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00186260;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  bVar1 = trial::url::reader::basic_authority<char>::do_next((basic_authority<char> *)&local_128);
  local_1c4[0] = bVar1;
  local_1c8 = local_1c8 & 0xffffff00;
  local_190[0] = !bVar1;
  local_188 = 0;
  sStack_180.pi_ = (sp_counted_base *)0x0;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
  ;
  local_130 = "";
  local_1b8 = (view_type *)local_1c4;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_001865d8;
  local_168 = &boost::unit_test::lazy_ostream::inst;
  local_160 = &local_1b8;
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_001865d8;
  local_148 = &boost::unit_test::lazy_ostream::inst;
  local_140 = local_1c4 + 4;
  local_1c4._4_8_ = &local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (local_190,&local_1b0,&local_138,0x30,2,2,2,"reader.next()",&local_178,"false",
             &local_158);
  boost::detail::shared_count::~shared_count(&sStack_180);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_host_port)
{
    const char input[] = "1.2.3.4:80";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_host);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1.2.3.4");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_port);
    BOOST_REQUIRE_EQUAL(reader.literal(), "80");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}